

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O0

void __thiscall ZipArchive::add(ZipArchive *this,ZipEntry *entry)

{
  uint8_t *puVar1;
  uint8_t *__dest;
  bool bVar2;
  undefined2 uVar3;
  uint uVar4;
  int iVar5;
  tm *ptVar6;
  size_t sVar7;
  void *__src;
  pointer puVar8;
  size_t __n;
  void *__buf;
  uint32_t local_78;
  uint32_t local_70;
  undefined4 local_60;
  undefined4 local_58;
  undefined4 local_50;
  bool local_41;
  bool local_31;
  bool ext64;
  CentralDirEntry *e;
  int fl;
  uint32_t msdos_ts;
  tm *lt;
  ZipEntry *entry_local;
  ZipArchive *this_local;
  
  ptVar6 = localtime(&entry->timeStamp);
  uVar4 = (ptVar6->tm_year + -0x50) * 0x2000000 | (ptVar6->tm_mon + 1) * 0x200000 |
          ptVar6->tm_mday << 0x10 | ptVar6->tm_hour << 0xb | ptVar6->tm_min << 5 |
          ptVar6->tm_sec >> 1;
  sVar7 = File::tell(&this->f);
  this->lastHeader = sVar7;
  iVar5 = std::__cxx11::string::length();
  puVar1 = this->entryPtr;
  local_31 = (bool)(this->force64 & 1);
  if (local_31 == false) {
    local_41 = true;
    if ((entry->dataSize < 0xffffffff) && (local_41 = true, entry->originalSize < 0xffffffff)) {
      local_41 = 0xfffffffe < this->lastHeader;
    }
    local_31 = local_41;
  }
  memset(puVar1,0,0x2e);
  builtin_memcpy(puVar1,"PK\x01\x02",4);
  puVar1[6] = '\x14';
  puVar1[7] = '\0';
  uVar3 = 8;
  if ((entry->store & 1U) != 0) {
    uVar3 = 0;
  }
  *(undefined2 *)(puVar1 + 10) = uVar3;
  *(uint32_t *)(puVar1 + 0x10) = entry->crc;
  if (local_31 == false) {
    local_50 = (undefined4)entry->dataSize;
  }
  else {
    local_50 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x14) = local_50;
  if (local_31 == false) {
    local_58 = (undefined4)entry->originalSize;
  }
  else {
    local_58 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x18) = local_58;
  *(uint16_t *)(puVar1 + 0x1c) = (uint16_t)iVar5;
  if (local_31 == false) {
    local_60 = (undefined4)this->lastHeader;
  }
  else {
    local_60 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x2a) = local_60;
  *(uint *)(puVar1 + 0xc) = uVar4;
  *(uint *)(puVar1 + 0x26) = (uint)entry->flags << 0x10;
  this->entryPtr = this->entryPtr + 0x2e;
  __dest = this->entryPtr;
  __src = (void *)std::__cxx11::string::c_str();
  memcpy(__dest,__src,(long)iVar5);
  this->entryPtr = this->entryPtr + iVar5;
  if (local_31 != false) {
    puVar1[6] = '-';
    puVar1[7] = '\0';
    *(short *)(puVar1 + 0x1e) = *(short *)(puVar1 + 0x1e) + 0x20;
    add::extra64.compSize._0_4_ = (undefined4)entry->dataSize;
    add::extra64.compSize._4_4_ = (undefined4)(entry->dataSize >> 0x20);
    add::extra64.uncompSize._0_4_ = (undefined4)entry->originalSize;
    add::extra64.uncompSize._4_4_ = (undefined4)(entry->originalSize >> 0x20);
    add::extra64.offset._0_4_ = (undefined4)this->lastHeader;
    add::extra64.offset._4_4_ = (undefined4)(this->lastHeader >> 0x20);
    puVar1 = this->entryPtr;
    *(ulong *)puVar1 = CONCAT44((undefined4)add::extra64.uncompSize,add::extra64._0_4_);
    *(ulong *)(puVar1 + 8) =
         CONCAT44((undefined4)add::extra64.compSize,add::extra64.uncompSize._4_4_);
    *(ulong *)(puVar1 + 0x10) =
         CONCAT44((undefined4)add::extra64.offset,add::extra64.compSize._4_4_);
    *(ulong *)(puVar1 + 0x18) = CONCAT44(add::extra64.disk,add::extra64.offset._4_4_);
    this->entryPtr = this->entryPtr + 0x20;
  }
  this->entryCount = this->entryCount + 1;
  __n = 0;
  add::head.method = 8;
  if ((entry->store & 1U) != 0) {
    add::head.method = 0;
  }
  add::head.crc = entry->crc;
  add::head.v1 = 0x14;
  if (local_31 == false) {
    local_70 = (uint32_t)entry->dataSize;
  }
  else {
    local_70 = 0xffffffff;
  }
  add::head.compSize = local_70;
  if (local_31 == false) {
    local_78 = (uint32_t)entry->originalSize;
  }
  else {
    local_78 = 0xffffffff;
  }
  add::head.uncompSize = local_78;
  add::head.exLen = 0;
  if (((entry->store & 1U) != 0) && ((this->zipAlign & 1U) != 0)) {
    __n = this->lastHeader + (long)iVar5 + 0x1e & 3;
    add::head.exLen = 4 - (short)__n;
  }
  if (local_31 != false) {
    add::head.exLen = 0x20;
    add::head.v1 = 0x2d;
  }
  add::head.dateTime = uVar4;
  add::head.nameLen = (uint16_t)iVar5;
  write<LocalEntry>(this,&add::head);
  write(this,(int)entry,__buf,__n);
  if (local_31 == false) {
    if (add::head.exLen != 0) {
      write(this,0x1770fb,(void *)(ulong)add::head.exLen,__n);
    }
  }
  else {
    write<Extra64>(this,&add::extra64);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&entry->data);
  if (bVar2) {
    puVar8 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&entry->data);
    write(this,(int)puVar8,(void *)entry->dataSize,__n);
  }
  return;
}

Assistant:

void ZipArchive::add(const ZipEntry& entry)
{
    static LocalEntry head = {0x04034b50, 10, 0, 0, 0, 0, 0, 0, 0, 0};
    static Extra64 extra64 = {0x1, 28, 0, 0, 0, 0};
    static const uint8_t zeroes[] = {0, 0, 0, 0};
    const struct tm* lt = localtime(&entry.timeStamp);
    // date:   YYYYYYYM MMMDDDDD
    // time:   HHHHHMMM MMMSSSSS
    uint32_t msdos_ts = ((lt->tm_year - 80) << 25) | ((lt->tm_mon + 1) << 21) |
                        (lt->tm_mday << 16) | (lt->tm_hour << 11) |
                        (lt->tm_min << 5) | (lt->tm_sec >> 1);

    lastHeader = f.tell(); // ftell_x(fp);

    int fl = entry.name.length();
    auto* e = reinterpret_cast<CentralDirEntry*>(entryPtr);

    bool ext64 = force64;
    if (!ext64)
        ext64 = (entry.dataSize > 0xfffffffe ||
                 entry.originalSize > 0xfffffffe || lastHeader > 0xfffffffeL);

    memset(e, 0, sizeof(CentralDirEntry));
    e->sig = 0x02014b50;
    e->v1 = 20;
    e->method = entry.store ? 0 : 8;
    e->crc = entry.crc;
    e->compSize = ext64 ? 0xffffffff : entry.dataSize;
    e->uncompSize = ext64 ? 0xffffffff : entry.originalSize;
    e->nameLen = fl;
    e->offset = ext64 ? 0xffffffff : lastHeader;
    e->dateTime = msdos_ts;
    e->attr1 = entry.flags << 16;

    entryPtr += sizeof(CentralDirEntry);
    memcpy(entryPtr, entry.name.c_str(), fl);
    entryPtr += fl;

    // ext64 = true;

    if (ext64) {
        e->v1 = 45;
        e->exLen += sizeof(Extra64);
        extra64.compSize = entry.dataSize;
        extra64.uncompSize = entry.originalSize;
        extra64.offset = lastHeader;
        memcpy(entryPtr, &extra64, sizeof(Extra64));
        entryPtr += sizeof(Extra64);
    }

    entryCount++;

    // printf("Added %d files in %ld bytes\n", entryCount, entryPtr - entries);

    // lastHeader 30 bytes
    head.method = entry.store ? 0 : 8;
    head.crc = entry.crc;
    head.v1 = 20;
    head.compSize = ext64 ? 0xffffffff : entry.dataSize;
    head.uncompSize = ext64 ? 0xffffffff : entry.originalSize;
    head.dateTime = msdos_ts;
    head.nameLen = fl;
    head.exLen = 0;

    if (entry.store && zipAlign)
        head.exLen = 4 - (lastHeader + fl + sizeof(LocalEntry)) % 4;

    if (ext64) {
        head.exLen = sizeof(Extra64);
        head.v1 = 45;
    }

    write(head);
    write(entry.name);

    if (ext64) {
        write(extra64);
    } else if (head.exLen > 0) {
        write(zeroes, head.exLen);
    }
    if (entry.data)
        write(entry.data.get(), entry.dataSize);
}